

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)

{
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var1;
  void *pvVar2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  bnode *__ptr;
  size_t sVar4;
  size_t *psVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  __suseconds_t *p_Var9;
  size_t asStack_d0 [13];
  undefined1 local_68 [8];
  timeval __test_begin;
  
  gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node('\b','\x01',1);
  __ptr->nentry = 0;
  psVar5 = asStack_d0 + 3;
  for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
    pcVar6 = (char *)((long)psVar5 + -0x10);
    asStack_d0[uVar7 + 3] = (size_t)pcVar6;
    *(char *)((long)psVar5 + -0x18) = -0x66;
    *(char *)((long)psVar5 + -0x17) = '\'';
    *(char *)((long)psVar5 + -0x16) = '\x10';
    *(char *)((long)psVar5 + -0x15) = '\0';
    *(char *)((long)psVar5 + -0x14) = '\0';
    *(char *)((long)psVar5 + -0x13) = '\0';
    *(char *)((long)psVar5 + -0x12) = '\0';
    *(char *)((long)psVar5 + -0x11) = '\0';
    sprintf(pcVar6,"key%d",uVar7 & 0xffffffff);
    *(int *)((long)&__test_begin.tv_usec + uVar7 * 4) = (int)uVar7;
    psVar5 = (size_t *)pcVar6;
  }
  p_Var9 = &__test_begin.tv_usec;
  *(char *)((long)psVar5 + -8) = '\x02';
  *(char *)((long)psVar5 + -7) = '\0';
  *(char *)((long)psVar5 + -6) = '\0';
  *(char *)((long)psVar5 + -5) = '\0';
  *(char *)((long)psVar5 + -4) = '\0';
  *(char *)((long)psVar5 + -3) = '\0';
  *(char *)((long)psVar5 + -2) = '\0';
  *(char *)((long)psVar5 + -1) = '\0';
  sVar4 = *(size_t *)((long)psVar5 + -8);
  p_Var1 = kv_ops->get_data_size;
  *(char *)((long)psVar5 + -8) = -0x42;
  *(char *)((long)psVar5 + -7) = '\'';
  *(char *)((long)psVar5 + -6) = '\x10';
  *(char *)((long)psVar5 + -5) = '\0';
  *(char *)((long)psVar5 + -4) = '\0';
  *(char *)((long)psVar5 + -3) = '\0';
  *(char *)((long)psVar5 + -2) = '\0';
  *(char *)((long)psVar5 + -1) = '\0';
  sVar4 = (*p_Var1)(__ptr,(void *)0x0,asStack_d0 + 3,p_Var9,sVar4);
  if (sVar4 != 0x12) {
    *(char *)((long)psVar5 + -8) = -0x75;
    *(char *)((long)psVar5 + -7) = '(';
    *(char *)((long)psVar5 + -6) = '\x10';
    *(char *)((long)psVar5 + -5) = '\0';
    *(char *)((long)psVar5 + -4) = '\0';
    *(char *)((long)psVar5 + -3) = '\0';
    *(char *)((long)psVar5 + -2) = '\0';
    *(char *)((long)psVar5 + -1) = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x1f7);
    kv_get_str_data_size_test(btree_kv_ops*)::__test_pass = 1;
    *(char *)((long)psVar5 + -8) = -0x53;
    *(char *)((long)psVar5 + -7) = '(';
    *(char *)((long)psVar5 + -6) = '\x10';
    *(char *)((long)psVar5 + -5) = '\0';
    *(char *)((long)psVar5 + -4) = '\0';
    *(char *)((long)psVar5 + -3) = '\0';
    *(char *)((long)psVar5 + -2) = '\0';
    *(char *)((long)psVar5 + -1) = '\0';
    __assert_fail("size == (size_t)(2*(ksize + vsize))",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x1f7,"void kv_get_str_data_size_test(btree_kv_ops *)");
  }
  for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
    pvVar2 = (void *)asStack_d0[lVar8 + 3];
    p_Var3 = kv_ops->set_kv;
    *(char *)((long)psVar5 + -8) = -0x1a;
    *(char *)((long)psVar5 + -7) = '\'';
    *(char *)((long)psVar5 + -6) = '\x10';
    *(char *)((long)psVar5 + -5) = '\0';
    *(char *)((long)psVar5 + -4) = '\0';
    *(char *)((long)psVar5 + -3) = '\0';
    *(char *)((long)psVar5 + -2) = '\0';
    *(char *)((long)psVar5 + -1) = '\0';
    (*p_Var3)(__ptr,(idx_t)lVar8,pvVar2,p_Var9);
    p_Var9 = (__suseconds_t *)((long)p_Var9 + 4);
  }
  __ptr->nentry = 10;
  *(char *)((long)psVar5 + -8) = '\n';
  *(char *)((long)psVar5 + -7) = '\0';
  *(char *)((long)psVar5 + -6) = '\0';
  *(char *)((long)psVar5 + -5) = '\0';
  *(char *)((long)psVar5 + -4) = '\0';
  *(char *)((long)psVar5 + -3) = '\0';
  *(char *)((long)psVar5 + -2) = '\0';
  *(char *)((long)psVar5 + -1) = '\0';
  p_Var1 = kv_ops->get_data_size;
  builtin_strncpy((char *)((long)psVar5 + -8),"\r(\x10",4);
  *(char *)((long)psVar5 + -4) = '\0';
  *(char *)((long)psVar5 + -3) = '\0';
  *(char *)((long)psVar5 + -2) = '\0';
  *(char *)((long)psVar5 + -1) = '\0';
  sVar4 = (*p_Var1)(__ptr,(void *)0x0,asStack_d0 + 3,&__test_begin.tv_usec,
                    *(size_t *)((long)psVar5 + -8));
  if (sVar4 == 0xb4) {
    builtin_strncpy((char *)((long)psVar5 + -8),"!(\x10",4);
    *(char *)((long)psVar5 + -4) = '\0';
    *(char *)((long)psVar5 + -3) = '\0';
    *(char *)((long)psVar5 + -2) = '\0';
    *(char *)((long)psVar5 + -1) = '\0';
    free(__ptr);
    builtin_strncpy((char *)((long)psVar5 + -8),"&(\x10",4);
    *(char *)((long)psVar5 + -4) = '\0';
    *(char *)((long)psVar5 + -3) = '\0';
    *(char *)((long)psVar5 + -2) = '\0';
    *(char *)((long)psVar5 + -1) = '\0';
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (kv_get_str_data_size_test(btree_kv_ops*)::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    builtin_strncpy((char *)((long)psVar5 + -8),"W(\x10",4);
    *(char *)((long)psVar5 + -4) = '\0';
    *(char *)((long)psVar5 + -3) = '\0';
    *(char *)((long)psVar5 + -2) = '\0';
    *(char *)((long)psVar5 + -1) = '\0';
    fprintf(_stderr,pcVar6,"kv_get_str_data_size_test");
    return;
  }
  *(char *)((long)psVar5 + -8) = -0x2c;
  *(char *)((long)psVar5 + -7) = '(';
  *(char *)((long)psVar5 + -6) = '\x10';
  *(char *)((long)psVar5 + -5) = '\0';
  *(char *)((long)psVar5 + -4) = '\0';
  *(char *)((long)psVar5 + -3) = '\0';
  *(char *)((long)psVar5 + -2) = '\0';
  *(char *)((long)psVar5 + -1) = '\0';
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
          ,0x201);
  kv_get_str_data_size_test(btree_kv_ops*)::__test_pass = 1;
  *(code **)((long)psVar5 + -8) = kv_get_str_kv_size_test;
  __assert_fail("size == (size_t)(2*(n*(ksize+vsize)))",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                ,0x201,"void kv_get_str_data_size_test(btree_kv_ops *)");
}

Assistant:

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();


    bnoderef node;
    uint8_t v;
    uint8_t i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    int *value = alca(int, n);
    void *new_minkey;
    size_t size;


    node = dummy_node(ksize, vsize, 1);
    node->nentry = 0;

    new_minkey = NULL;

    for (i = 0; i < n; i++){
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        value[i] = i;
    }

    // calculate datasize to extend empty node
    size = kv_ops->get_data_size(node, new_minkey, key, value, 2);
    TEST_CHK(size == (size_t)(2*(ksize + vsize)));

    // set kvs
    for (i = 0; i < n; i++){
        kv_ops->set_kv(node, i, key[i], (void *)&value[i]);
    }

    // cacluate datasize to extend node with n entries
    node->nentry = n;
    size = kv_ops->get_data_size(node, new_minkey, key, value, n);
    TEST_CHK(size == (size_t)(2*(n*(ksize+vsize))));

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_str_data_size_test");
}